

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::setFontFamily(QTextEdit *this,QString *fontFamily)

{
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QArrayDataPointer<QString> local_70;
  undefined1 local_58 [24];
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_58);
  local_40.d = (fontFamily->d).d;
  local_40.ptr = (fontFamily->d).ptr;
  local_40.size = (fontFamily->d).size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  args._M_len = 1;
  args._M_array = (iterator)&local_40;
  QList<QString>::QList((QList<QString> *)&local_70,args);
  QTextCharFormat::setFontFamilies((QTextCharFormat *)local_58,(QStringList *)&local_70);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  mergeCurrentCharFormat(this,(QTextCharFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setFontFamily(const QString &fontFamily)
{
    QTextCharFormat fmt;
    fmt.setFontFamilies({fontFamily});
    mergeCurrentCharFormat(fmt);
}